

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JlDataModel.c
# Opt level: O3

JL_STATUS JlGetObjectNumberU64(JlDataObject *NumberObject,uint64_t *pNumber64)

{
  JL_STATUS JVar1;
  anon_union_8_3_eb7f4dc6_for_JlNumber_1 aVar2;
  
  if (pNumber64 == (uint64_t *)0x0 || NumberObject == (JlDataObject *)0x0) {
    return JL_STATUS_INVALID_PARAMETER;
  }
  if (NumberObject->Type == JL_DATA_TYPE_NUMBER) {
    JVar1 = JL_STATUS_SUCCESS;
    if ((NumberObject->field_2).Number.Type == JL_NUM_TYPE_UNSIGNED) {
      aVar2 = (NumberObject->field_2).Number.field_1;
      goto LAB_00101cf7;
    }
    JVar1 = JL_STATUS_VALUE_OUT_OF_RANGE;
  }
  else {
    JVar1 = JL_STATUS_WRONG_TYPE;
  }
  aVar2.u64 = 0;
LAB_00101cf7:
  *pNumber64 = (uint64_t)aVar2;
  return JVar1;
}

Assistant:

JL_STATUS
    JlGetObjectNumberU64
    (
        JlDataObject const* NumberObject,
        uint64_t*           pNumber64
    )
{
    JL_STATUS jlStatus;

    if(     NULL != NumberObject
        &&  NULL != pNumber64 )
    {
        if(     JL_DATA_TYPE_NUMBER == NumberObject->Type
            &&  JL_NUM_TYPE_UNSIGNED == NumberObject->Number.Type )
        {
            // Positive integers will always be stored as unsigned, even if they were added as signed number
            *pNumber64 = NumberObject->Number.u64;
            jlStatus = JL_STATUS_SUCCESS;
        }
        else if( JL_DATA_TYPE_NUMBER == NumberObject->Type )
        {
            // Wrong type of number
            *pNumber64 = 0;
            jlStatus = JL_STATUS_VALUE_OUT_OF_RANGE;
        }
        else
        {
            *pNumber64 = 0;
            jlStatus = JL_STATUS_WRONG_TYPE;
        }
    }
    else
    {
        jlStatus = JL_STATUS_INVALID_PARAMETER;
    }

    return jlStatus;
}